

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3SnippetFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  char **ppIter;
  byte bVar1;
  sqlite3_stmt *pStmt;
  sqlite3_module *pTokenizer;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  uint uVar16;
  int iVar5;
  int iVar6;
  uint uVar7;
  void *__s;
  long *plVar8;
  ulong uVar9;
  uchar *puVar10;
  Mem *pMVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  sqlite3_vtab *psVar15;
  ulong uVar17;
  uint *puVar18;
  ulong uVar19;
  i64 iVar20;
  byte *p;
  ulong uVar21;
  sqlite3_vtab *psVar22;
  uchar *zAppend;
  ulong uVar23;
  Fts3Cursor *pFVar24;
  code *xDel;
  uint uVar25;
  int iVar26;
  char *pcVar27;
  sqlite3_tokenizer_cursor *psVar28;
  char *pcVar29;
  ulong uVar30;
  long lVar31;
  sqlite3_tokenizer_module *psVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iBegin;
  int iCurrent;
  int iCurrent_1;
  char *ZDUMMY;
  StrBuffer res;
  sqlite3_tokenizer_cursor *pC_1;
  char *ZDUMMY_1;
  sqlite3_tokenizer_cursor *pC;
  int DUMMY1;
  int DUMMY2;
  int DUMMY1_1;
  Fts3Cursor *pCsr;
  SnippetFragment aSnippet [4];
  int local_204;
  ulong local_200;
  ulong local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  ulong local_1e0;
  sqlite3_vtab *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  Fts3Cursor *local_1b8;
  sqlite3_tokenizer_module *local_1b0;
  sqlite3_vtab *local_1a8;
  long local_1a0;
  char *local_198;
  uint local_18c;
  StrBuffer local_188;
  Fts3Cursor *local_178;
  undefined4 local_170;
  int local_16c;
  undefined1 local_168 [16];
  undefined8 local_158;
  uchar *local_150;
  sqlite3_context *local_148;
  ulong local_140;
  sqlite3_tokenizer_cursor *local_138;
  Fts3Cursor *local_130;
  ulong local_128;
  ulong local_120;
  undefined8 local_118;
  int local_110;
  uint local_10c;
  int local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined1 local_f8 [16];
  i64 local_e8;
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  ulong local_c8;
  char *local_c0;
  uint *local_b8;
  ulong local_b0;
  sqlite3_tokenizer_cursor *local_a8;
  Fts3Cursor *local_a0;
  uint local_98 [4];
  ulong local_88 [11];
  
  if (6 < nVal) {
    pContext->isError = 1;
    sqlite3VdbeMemSetStr
              (pContext->pOut,"wrong number of arguments to function snippet()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  iVar5 = fts3FunctionArg(pContext,"snippet",*apVal,&local_a0);
  if (iVar5 != 0) {
    return;
  }
  iVar20 = 0xf;
  local_1b0 = (sqlite3_tokenizer_module *)0xffffffff;
  pcVar27 = "<b>...</b>";
  pcVar29 = "</b>";
  switch(nVal) {
  case 6:
    iVar20 = sqlite3VdbeIntValue(apVal[5]);
  case 5:
    local_1b0 = (sqlite3_tokenizer_module *)sqlite3VdbeIntValue(apVal[4]);
  case 4:
    pcVar27 = (char *)sqlite3ValueText(apVal[3],'\x01');
  case 3:
    pcVar29 = (char *)sqlite3ValueText(apVal[2],'\x01');
  case 2:
    local_c0 = (char *)sqlite3ValueText(apVal[1],'\x01');
    if ((pcVar29 == (char *)0x0 || (uchar *)pcVar27 == (uchar *)0x0) || local_c0 == (char *)0x0) {
      sqlite3_result_error_nomem(pContext);
      return;
    }
    if ((int)iVar20 == 0) {
      setResultStrOrError(pContext,"",-1,'\x01',(_func_void_void_ptr *)0x0);
      return;
    }
    break;
  default:
    local_c0 = "<b>";
  }
  iVar5 = fts3CursorSeek(pContext,local_a0);
  if (iVar5 != 0) {
    return;
  }
  psVar22 = (local_a0->base).pVtab;
  local_188.z = (char *)0x0;
  local_188.n = 0;
  local_188.nAlloc = 0;
  if (local_a0->pExpr != (Fts3Expr *)0x0) {
    iVar5 = -0x40;
    if (-0x40 < (int)iVar20) {
      iVar5 = (int)iVar20;
    }
    iVar26 = 0x40;
    if (iVar5 < 0x40) {
      iVar26 = iVar5;
    }
    uVar25 = -iVar26;
    local_d8 = (ulong)(iVar26 - 1);
    local_140 = 1;
    local_1b8 = local_a0;
    local_1d8 = psVar22;
    local_18c = uVar25;
    local_150 = (uchar *)pcVar27;
    local_148 = pContext;
    local_e8 = iVar20;
    local_d0 = pcVar29;
    do {
      local_1e0 = (ulong)uVar25;
      if (-1 < (int)iVar20) {
        local_1e0 = (long)((int)local_d8 + (int)local_140) / (long)(int)local_140 & 0xffffffff;
      }
      iVar5 = *(int *)&psVar22[2].pModule;
      uVar19 = 0;
      local_200 = 0;
      uVar30 = 0;
      do {
        *(undefined1 (*) [16])(local_98 + uVar19 * 6) = (undefined1  [16])0x0;
        local_88[uVar19 * 3] = 0;
        local_c8 = uVar19;
        if (iVar5 < 1) {
          uVar19 = 0;
        }
        else {
          local_b8 = local_98 + uVar19 * 6;
          iVar26 = -1;
          uVar19 = 0;
          uVar16 = 0;
          do {
            if ((int)(uint)local_1b0 < 0 || uVar16 == (uint)local_1b0) {
              local_1d0 = CONCAT44(local_1d0._4_4_,uVar16);
              local_168 = (undefined1  [16])0x0;
              local_158 = 0;
              local_128 = 0;
              local_118._0_4_ = 0;
              local_130 = local_a0;
              local_110 = iVar26;
              local_b0 = uVar19;
              iVar5 = fts3ExprIterate2(local_a0->pExpr,(int *)&local_118,fts3ExprLoadDoclistsCb,
                                       &local_130);
              if (iVar5 == 0) {
                iVar26 = (int)local_128;
                uVar19 = local_128 & 0xffffffff;
                iVar6 = sqlite3_initialize();
                iVar5 = 7;
                if (iVar6 == 0) {
                  __s = sqlite3Malloc((long)iVar26 * 0x30);
                  local_168._8_8_ = __s;
                  if (__s != (void *)0x0) {
                    memset(__s,0,(long)iVar26 * 0x30);
                    local_178 = local_1b8;
                    local_170 = (uint)local_1d0;
                    local_16c = (int)local_1e0;
                    local_168._0_4_ = iVar26;
                    local_158 = CONCAT44(local_158._4_4_,0xffffffff);
                    local_130 = (Fts3Cursor *)((ulong)local_130 & 0xffffffff00000000);
                    iVar5 = fts3ExprIterate2(local_1b8->pExpr,(int *)&local_130,
                                             fts3SnippetFindPositions,&local_178);
                    if (iVar5 == 0) {
                      if (0 < iVar26) {
                        plVar8 = (long *)(local_168._8_8_ + 0x18);
                        uVar12 = 0;
                        do {
                          uVar17 = 1L << ((byte)uVar12 & 0x3f);
                          if (*plVar8 == 0) {
                            uVar17 = 0;
                          }
                          uVar30 = uVar30 | uVar17;
                          uVar12 = uVar12 + 1;
                          plVar8 = plVar8 + 6;
                        } while (uVar19 != uVar12);
                      }
                      uVar12 = 0xffffffff;
                      uVar13 = local_158 & 0xffffffff;
                      uVar19 = 0;
                      psVar28 = (sqlite3_tokenizer_cursor *)0x0;
                      uVar17 = 0;
                      local_e0 = uVar30;
                      do {
                        iVar5 = (int)uVar12;
                        local_10c = (uint)uVar17;
                        local_120 = uVar19;
                        local_a8 = psVar28;
                        do {
                          if (-1 < (int)uVar13) {
                            if (0 < (long)(int)local_168._0_4_) {
                              iVar26 = 0x7fffffff;
                              lVar14 = 0;
                              do {
                                if ((*(long *)(local_168._8_8_ + lVar14 + 0x18) != 0) &&
                                   (iVar6 = *(int *)(local_168._8_8_ + lVar14 + 0x10),
                                   iVar6 < iVar26)) {
                                  iVar26 = iVar6;
                                }
                                lVar14 = lVar14 + 0x30;
                              } while ((long)(int)local_168._0_4_ * 0x30 != lVar14);
                              if (iVar26 != 0x7fffffff) {
                                iVar6 = (iVar26 - local_16c) + 1;
                                local_158 = CONCAT44(local_158._4_4_,iVar6);
                                lVar14 = 0x28;
                                lVar31 = 0;
                                do {
                                  uVar4 = local_168._8_8_;
                                  ppIter = (char **)(local_168._8_8_ + lVar14);
                                  fts3SnippetAdvance((char **)(local_168._8_8_ + lVar14 + -0x10),
                                                     (int *)(local_168._8_8_ + lVar14 + -0x18),
                                                     iVar26 + 1);
                                  fts3SnippetAdvance(ppIter,(int *)(uVar4 + lVar14 + -8),iVar6);
                                  lVar31 = lVar31 + 1;
                                  lVar14 = lVar14 + 0x30;
                                } while (lVar31 < (int)local_168._0_4_);
                                goto LAB_001c604a;
                              }
                            }
                            sqlite3_free((void *)local_168._8_8_);
                            uVar19 = local_b0;
                            iVar20 = local_e8;
                            psVar22 = local_1d8;
                            local_a0 = local_1b8;
                            uVar30 = local_e0;
                            uVar25 = local_18c;
                            iVar26 = local_110;
                            uVar16 = (uint)local_1d0;
                            if (local_110 < iVar5) {
                              *local_b8 = (uint)local_1d0;
                              local_b8[1] = local_10c;
                              *(ulong *)(local_b8 + 2) = local_120;
                              *(sqlite3_tokenizer_cursor **)(local_b8 + 4) = local_a8;
                              uVar19 = local_120;
                              iVar26 = iVar5;
                            }
                            goto LAB_001c633a;
                          }
                          local_158 = (ulong)local_158._4_4_ << 0x20;
                          if ((int)local_168._0_4_ < 1) {
                            uVar13 = 0;
                            psVar28 = (sqlite3_tokenizer_cursor *)0x0;
                            uVar19 = 0;
                            uVar12 = 0;
                          }
                          else {
                            lVar14 = 0x10;
                            lVar31 = 0;
                            do {
                              fts3SnippetAdvance((char **)(local_168._8_8_ + lVar14 + 8),
                                                 (int *)(local_168._8_8_ + lVar14),local_16c);
                              lVar31 = lVar31 + 1;
                              lVar14 = lVar14 + 0x30;
                            } while (lVar31 < (int)local_168._0_4_);
LAB_001c604a:
                            uVar30 = local_158;
                            iVar26 = (int)local_158;
                            uVar13 = local_158 & 0xffffffff;
                            if ((int)local_168._0_4_ < 1) {
                              psVar28 = (sqlite3_tokenizer_cursor *)0x0;
                              uVar19 = 0;
                              uVar12 = 0;
                            }
                            else {
                              psVar22 = (sqlite3_vtab *)(ulong)(uint)local_168._0_4_;
                              iVar6 = local_16c + (int)local_158;
                              psVar15 = (sqlite3_vtab *)0x0;
                              uVar12 = 0;
                              psVar28 = (sqlite3_tokenizer_cursor *)0x0;
                              local_1a0 = local_168._8_8_;
                              uVar17 = 0;
                              uVar23 = local_200;
                              lVar14 = local_168._8_8_;
                              local_1a8 = psVar22;
                              do {
                                p = *(byte **)(lVar14 + 0x28 + (long)psVar15 * 0x30);
                                uVar19 = uVar17;
                                if (p != (byte *)0x0) {
                                  puVar18 = (uint *)((long)psVar15 * 0x30 + lVar14);
                                  uVar25 = puVar18[8];
                                  if (iVar26 <= (int)uVar25 && (int)uVar25 < iVar6) {
                                    uVar21 = 1L << ((byte)psVar15 & 0x3f);
                                    uVar16 = *puVar18;
                                    uVar19 = uVar17 | 1L << ((ulong)psVar15 & 0x3f);
                                    local_1c8 = (ulong)(uVar16 + 1 & 0xfffffffe);
                                    lVar14 = (ulong)uVar16 - 1;
                                    auVar40._8_4_ = (int)lVar14;
                                    auVar40._0_8_ = lVar14;
                                    auVar40._12_4_ = (int)((ulong)lVar14 >> 0x20);
                                    local_f8 = auVar40 ^ _DAT_001d5060;
                                    local_1f8 = uVar21;
                                    while( true ) {
                                      uVar7 = (int)uVar12 + 1000;
                                      if (((uVar17 | uVar23) & uVar21) != 0) {
                                        uVar7 = (int)uVar12 + 1;
                                      }
                                      uVar12 = (ulong)uVar7;
                                      if (0 < (int)uVar16) {
                                        uVar9 = 1L << ((char)uVar25 - (char)uVar30 & 0x3fU);
                                        auVar33._8_8_ = 0;
                                        auVar33._0_8_ = psVar28;
                                        auVar38._8_4_ = (int)uVar9;
                                        auVar38._0_8_ = uVar9;
                                        auVar38._12_4_ = (int)(uVar9 >> 0x20);
                                        uVar17 = local_1c8;
                                        auVar42 = _DAT_001df1f0;
                                        do {
                                          auVar35 = auVar42;
                                          auVar40 = auVar33;
                                          auVar34._8_8_ = auVar38._8_8_ >> auVar35._8_8_;
                                          auVar34._0_8_ = uVar9 >> auVar35._0_8_;
                                          auVar33 = auVar34 | auVar40;
                                          auVar42._0_8_ = auVar35._0_8_ + 2;
                                          auVar42._8_8_ = auVar35._8_8_ + 2;
                                          uVar17 = uVar17 - 2;
                                        } while (uVar17 != 0);
                                        auVar35 = auVar35 ^ _DAT_001d5060;
                                        iVar37 = -(uint)((int)local_f8._0_4_ < auVar35._0_4_);
                                        auVar39._4_4_ = -(uint)((int)local_f8._4_4_ < auVar35._4_4_)
                                        ;
                                        iVar41 = -(uint)((int)local_f8._8_4_ < auVar35._8_4_);
                                        auVar39._12_4_ =
                                             -(uint)((int)local_f8._12_4_ < auVar35._12_4_);
                                        auVar43._4_4_ = iVar37;
                                        auVar43._0_4_ = iVar37;
                                        auVar43._8_4_ = iVar41;
                                        auVar43._12_4_ = iVar41;
                                        auVar36._4_4_ = -(uint)(auVar35._4_4_ == local_f8._4_4_);
                                        auVar36._12_4_ = -(uint)(auVar35._12_4_ == local_f8._12_4_);
                                        auVar36._0_4_ = auVar36._4_4_;
                                        auVar36._8_4_ = auVar36._12_4_;
                                        auVar39._0_4_ = auVar39._4_4_;
                                        auVar39._8_4_ = auVar39._12_4_;
                                        auVar39 = auVar39 | auVar36 & auVar43;
                                        auVar40 = ~auVar39 & auVar33 | auVar40 & auVar39;
                                        psVar28 = (sqlite3_tokenizer_cursor *)
                                                  (auVar40._8_8_ | auVar40._0_8_);
                                      }
                                      bVar1 = *p;
                                      lVar14 = local_1a0;
                                      psVar22 = local_1a8;
                                      if (bVar1 < 2) break;
                                      if ((char)bVar1 < '\0') {
                                        local_1c0 = uVar12;
                                        local_138 = psVar28;
                                        uVar7 = sqlite3Fts3GetVarint32((char *)p,(int *)&local_130);
                                        uVar17 = (ulong)uVar7;
                                        uVar12 = local_1c0;
                                        uVar21 = local_1f8;
                                        uVar23 = local_200;
                                        psVar28 = local_138;
                                        uVar7 = (uint)local_130;
                                      }
                                      else {
                                        uVar17 = 1;
                                        uVar7 = (uint)bVar1;
                                      }
                                      uVar25 = (uVar25 + uVar7) - 2;
                                      lVar14 = local_1a0;
                                      psVar22 = local_1a8;
                                      if (((int)uVar25 < iVar26) ||
                                         (p = p + uVar17, uVar17 = uVar19, iVar6 <= (int)uVar25))
                                      break;
                                    }
                                  }
                                }
                                psVar15 = (sqlite3_vtab *)((long)&psVar15->pModule + 1);
                                uVar17 = uVar19;
                              } while (psVar15 != psVar22);
                            }
                          }
                          uVar17 = uVar13;
                        } while ((int)uVar12 <= iVar5);
                      } while( true );
                    }
                    sqlite3_free((void *)local_168._8_8_);
                  }
                }
              }
              goto LAB_001c68da;
            }
LAB_001c633a:
            uVar16 = uVar16 + 1;
            iVar5 = *(int *)&psVar22[2].pModule;
          } while ((int)uVar16 < iVar5);
        }
        local_200 = local_200 | uVar19;
        uVar19 = local_c8 + 1;
      } while (uVar19 != local_140);
      if ((uVar30 == local_200) || (local_140 == 4)) goto LAB_001c63c7;
      local_140 = local_140 + 1;
    } while( true );
  }
  pcVar27 = "";
  iVar5 = 0;
  xDel = (_func_void_void_ptr *)0x0;
LAB_001c692f:
  setResultStrOrError(pContext,pcVar27,iVar5,'\x01',xDel);
  return;
LAB_001c63c7:
  local_120 = (ulong)((int)local_140 - 1);
  uVar30 = local_140 & 0xffffffff;
  uVar25 = (uint)local_1e0;
  local_1f8 = 0;
  pFVar24 = local_a0;
  local_1d0 = uVar30;
  do {
    psVar22 = (pFVar24->base).pVtab;
    local_1e8 = 0;
    local_1c0 = (ulong)local_98[local_1f8 * 6 + 1];
    local_1c8 = local_88[local_1f8 * 3];
    iVar5 = local_98[local_1f8 * 6] + 1;
    puVar10 = sqlite3_column_text(pFVar24->pStmt,iVar5);
    pStmt = pFVar24->pStmt;
    if (puVar10 == (uchar *)0x0) {
      pMVar11 = columnMem(pStmt,iVar5);
      uVar16._0_2_ = pMVar11->flags;
      uVar16._2_1_ = pMVar11->enc;
      uVar16._3_1_ = pMVar11->eSubtype;
      columnMallocFailure(pStmt);
      iVar5 = 0;
      if ((0xaaaaaaaaU >> (uVar16 & 0x1f) & 1) == 0) {
        iVar5 = 7;
      }
    }
    else {
      iVar5 = sqlite3_column_bytes(pStmt,iVar5);
      pTokenizer = psVar22[3].pModule;
      psVar32 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
      local_1a0 = CONCAT44(local_1a0._4_4_,iVar5);
      iVar5 = sqlite3Fts3OpenTokenizer
                        ((sqlite3_tokenizer *)pTokenizer,pFVar24->iLangid,(char *)puVar10,iVar5,
                         (sqlite3_tokenizer_cursor **)&local_118);
      if (iVar5 != 0) break;
      local_200 = local_200 & 0xffffffff00000000;
      local_138 = (sqlite3_tokenizer_cursor *)CONCAT44(local_118._4_4_,(int)local_118);
      bVar3 = false;
      local_1a8 = psVar22;
      do {
        local_108 = -1;
        local_204 = 0;
        local_1ec = 0;
        iVar5 = (*psVar32->xNext)(local_138,&local_198,&local_108,&local_204,&local_1ec,&local_1e8);
        if (iVar5 != 0) {
          if (iVar5 == 0x65) {
            puVar10 = puVar10 + (int)local_200;
LAB_001c6837:
            iVar5 = fts3StringAppend(&local_188,(char *)puVar10,-1);
          }
          break;
        }
        iVar5 = 0;
        uVar19 = local_1c0;
        if ((int)local_1c0 <= local_1e8) {
          if (!bVar3) {
            if (local_1c8 == 0) {
              local_1c8 = 0;
            }
            else {
              uVar12 = 0;
              iVar5 = 1;
              do {
                iVar26 = iVar5;
                uVar17 = uVar12 & 0x3f;
                uVar12 = uVar12 + 1;
                iVar5 = iVar26 + 1;
                uVar16 = uVar25;
              } while ((local_1c8 >> uVar17 & 1) == 0);
              do {
                uVar16 = uVar16 - 1;
                iVar26 = iVar26 + -1;
              } while ((local_1c8 >> ((ulong)uVar16 & 0x3f) & 1) == 0);
              if (1 < iVar26) {
                local_1e4 = 0;
                local_f8._0_8_ = *(sqlite3_tokenizer_module **)&(local_1a8[3].pModule)->iVersion;
                local_1b0 = psVar32;
                iVar5 = sqlite3Fts3OpenTokenizer
                                  ((sqlite3_tokenizer *)local_1a8[3].pModule,local_1b8->iLangid,
                                   (char *)(puVar10 + local_204),(int)local_1a0 - local_204,
                                   (sqlite3_tokenizer_cursor **)&local_178);
                pFVar24 = local_178;
                uVar30 = local_1d0;
                psVar32 = local_1b0;
                if (iVar5 != 0) break;
                iVar26 = iVar26 / 2 + (int)local_1e0;
                do {
                  iVar6 = local_1e4;
                  if (iVar26 <= local_1e4) {
                    (**(code **)(local_f8._0_8_ + 0x20))(pFVar24);
                    goto LAB_001c6654;
                  }
                  local_fc = 0;
                  local_100 = 0;
                  local_104 = 0;
                  iVar5 = (**(code **)(local_f8._0_8_ + 0x28))
                                    (pFVar24,&local_130,&local_fc,&local_100,&local_104,&local_1e4);
                } while (iVar5 == 0);
                (**(code **)(local_f8._0_8_ + 0x20))(pFVar24);
                uVar30 = local_1d0;
                psVar32 = local_1b0;
                if (iVar5 != 0x65) break;
LAB_001c6654:
                iVar5 = ((uint)(iVar6 < iVar26) - (int)local_1e0) + local_1e4;
                if (iVar5 < 1) {
                  iVar5 = 0;
                }
                local_1c8 = local_1c8 >> ((byte)iVar5 & 0x3f);
                uVar19 = (ulong)(uint)((int)local_1c0 + iVar5);
                uVar30 = local_1d0;
                psVar32 = local_1b0;
              }
            }
            if ((local_1f8 == 0) && ((int)uVar19 < 1)) {
              zAppend = puVar10;
              iVar5 = local_204;
              if (local_204 != 0) goto LAB_001c66d2;
            }
            else {
              zAppend = local_150;
              iVar5 = -1;
LAB_001c66d2:
              iVar5 = fts3StringAppend(&local_188,(char *)zAppend,iVar5);
              if (iVar5 != 0) break;
            }
            bVar3 = true;
            iVar5 = 0;
            if (local_1e8 < (int)uVar19) goto LAB_001c67e1;
          }
          pcVar27 = local_d0;
          uVar12 = local_1c8;
          if ((int)local_1e0 + (int)uVar19 <= local_1e8) {
            iVar5 = 0;
            puVar10 = local_150;
            if (local_1f8 == local_120) goto LAB_001c6837;
            break;
          }
          cVar2 = (char)local_1e8;
          iVar5 = 0;
          local_1c0 = uVar19;
          if ((int)uVar19 < local_1e8) {
            iVar5 = fts3StringAppend(&local_188,(char *)(puVar10 + (int)local_200),
                                     local_204 - (int)local_200);
          }
          uVar12 = 1L << (cVar2 - (char)uVar19 & 0x3fU) & uVar12;
          if ((iVar5 == 0) && (uVar12 != 0)) {
            iVar5 = fts3StringAppend(&local_188,local_c0,-1);
          }
          if (((iVar5 == 0) &&
              (iVar5 = fts3StringAppend(&local_188,(char *)(puVar10 + local_204),
                                        local_1ec - local_204), iVar5 == 0)) && (uVar12 != 0)) {
            iVar5 = fts3StringAppend(&local_188,pcVar27,-1);
          }
          bVar3 = true;
          local_200 = CONCAT44(local_200._4_4_,local_1ec);
          uVar19 = local_1c0;
        }
LAB_001c67e1:
        local_1c0 = uVar19;
      } while (iVar5 == 0);
      (*psVar32->xClose)(local_138);
    }
    local_1f8 = local_1f8 + 1;
    if ((uVar30 <= local_1f8) || (pFVar24 = local_1b8, iVar5 != 0)) break;
  } while( true );
LAB_001c68da:
  pContext = local_148;
  psVar22 = local_1d8;
  sqlite3_blob_close((sqlite3_blob *)local_1d8[0x13].zErrMsg);
  psVar22[0x13].zErrMsg = (char *)0x0;
  if (iVar5 != 0) {
    sqlite3_result_error_code(pContext,iVar5);
    sqlite3_free(local_188.z);
    return;
  }
  xDel = sqlite3_free;
  iVar5 = -1;
  pcVar27 = local_188.z;
  goto LAB_001c692f;
}

Assistant:

static void fts3SnippetFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of apVal[] array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  const char *zStart = "<b>";
  const char *zEnd = "</b>";
  const char *zEllipsis = "<b>...</b>";
  int iCol = -1;
  int nToken = 15;                /* Default number of tokens in snippet */

  /* There must be at least one argument passed to this function (otherwise
  ** the non-overloaded version would have been called instead of this one).
  */
  assert( nVal>=1 );

  if( nVal>6 ){
    sqlite3_result_error(pContext, 
        "wrong number of arguments to function snippet()", -1);
    return;
  }
  if( fts3FunctionArg(pContext, "snippet", apVal[0], &pCsr) ) return;

  switch( nVal ){
    case 6: nToken = sqlite3_value_int(apVal[5]);
    case 5: iCol = sqlite3_value_int(apVal[4]);
    case 4: zEllipsis = (const char*)sqlite3_value_text(apVal[3]);
    case 3: zEnd = (const char*)sqlite3_value_text(apVal[2]);
    case 2: zStart = (const char*)sqlite3_value_text(apVal[1]);
  }
  if( !zEllipsis || !zEnd || !zStart ){
    sqlite3_result_error_nomem(pContext);
  }else if( nToken==0 ){
    sqlite3_result_text(pContext, "", -1, SQLITE_STATIC);
  }else if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Snippet(pContext, pCsr, zStart, zEnd, zEllipsis, iCol, nToken);
  }
}